

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::CodeGeneratorResponse_File::Clear(CodeGeneratorResponse_File *this)

{
  uint uVar1;
  LogMessage *other;
  undefined8 *puVar2;
  LogFinisher local_51;
  LogMessage local_50;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 0xf) != 0) {
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)((ulong)(this->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
      puVar2[1] = 0;
      *(undefined1 *)*puVar2 = 0;
    }
    if ((uVar1 & 2) != 0) {
      puVar2 = (undefined8 *)((ulong)(this->insertion_point_).tagged_ptr_.ptr_ & 0xfffffffffffffffe)
      ;
      puVar2[1] = 0;
      *(undefined1 *)*puVar2 = 0;
    }
    if ((uVar1 & 4) != 0) {
      puVar2 = (undefined8 *)((ulong)(this->content_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
      puVar2[1] = 0;
      *(undefined1 *)*puVar2 = 0;
    }
    if ((uVar1 & 8) != 0) {
      if (this->generated_code_info_ == (GeneratedCodeInfo *)0x0) {
        internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/plugin.pb.cc"
                   ,0x3fd);
        other = internal::LogMessage::operator<<
                          (&local_50,"CHECK failed: generated_code_info_ != nullptr: ");
        internal::LogFinisher::operator=(&local_51,other);
        internal::LogMessage::~LogMessage(&local_50);
      }
      GeneratedCodeInfo::Clear(this->generated_code_info_);
    }
  }
  (this->_has_bits_).has_bits_[0] = 0;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) != 0) {
    internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
              (&(this->super_Message).super_MessageLite._internal_metadata_);
  }
  return;
}

Assistant:

void CodeGeneratorResponse_File::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.compiler.CodeGeneratorResponse.File)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x0000000fu) {
    if (cached_has_bits & 0x00000001u) {
      name_.ClearNonDefaultToEmpty();
    }
    if (cached_has_bits & 0x00000002u) {
      insertion_point_.ClearNonDefaultToEmpty();
    }
    if (cached_has_bits & 0x00000004u) {
      content_.ClearNonDefaultToEmpty();
    }
    if (cached_has_bits & 0x00000008u) {
      GOOGLE_DCHECK(generated_code_info_ != nullptr);
      generated_code_info_->Clear();
    }
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>();
}